

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cpp
# Opt level: O2

void __thiscall argo::unparser::unparse_array(unparser *this,json *j,int indent_level)

{
  pointer puVar1;
  type tVar2;
  writer *pwVar3;
  json_array *pjVar4;
  ulong uVar5;
  pointer puVar6;
  allocator local_72;
  allocator local_71;
  string local_70;
  string local_50;
  
  print_indent(this,indent_level);
  pwVar3 = operator<<(this->m_writer,'[');
  std::__cxx11::string::string((string *)&local_70,this->m_space,&local_71);
  pwVar3 = operator<<(pwVar3,&local_70);
  std::__cxx11::string::string((string *)&local_50,this->m_newline,&local_72);
  operator<<(pwVar3,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  pjVar4 = json::get_array(j);
  uVar5 = (ulong)((long)(pjVar4->
                        super__Vector_base<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pjVar4->
                       super__Vector_base<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start) >> 3;
  pjVar4 = json::get_array(j);
  puVar1 = (pjVar4->
           super__Vector_base<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (puVar6 = (pjVar4->
                super__Vector_base<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar1; puVar6 = puVar6 + 1) {
    tVar2 = json::get_instance_type
                      ((puVar6->_M_t).
                       super___uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_>._M_t.
                       super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
                       super__Head_base<0UL,_argo::json_*,_false>._M_head_impl);
    if (tVar2 != object_e) {
      tVar2 = json::get_instance_type
                        ((puVar6->_M_t).
                         super___uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_>._M_t.
                         super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
                         super__Head_base<0UL,_argo::json_*,_false>._M_head_impl);
      if (tVar2 != array_e) {
        print_indent(this,this->m_indent_inc + indent_level);
      }
    }
    unparse(this,(puVar6->_M_t).super___uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_>.
                 _M_t.super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
                 super__Head_base<0UL,_argo::json_*,_false>._M_head_impl,
            this->m_indent_inc + indent_level);
    if (1 < (int)uVar5) {
      pwVar3 = operator<<(this->m_writer,',');
      std::__cxx11::string::string((string *)&local_70,this->m_space,(allocator *)&local_50);
      operator<<(pwVar3,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
    }
    pwVar3 = this->m_writer;
    std::__cxx11::string::string((string *)&local_70,this->m_newline,(allocator *)&local_50);
    operator<<(pwVar3,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    uVar5 = (ulong)((int)uVar5 - 1);
  }
  print_indent(this,indent_level);
  pwVar3 = this->m_writer;
  std::__cxx11::string::string((string *)&local_70,this->m_space,(allocator *)&local_50);
  pwVar3 = operator<<(pwVar3,&local_70);
  operator<<(pwVar3,']');
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void unparser::unparse_array(const json &j, int indent_level)
{
    print_indent(indent_level);
    m_writer << '[' << m_space << m_newline;
    int n = j.get_array().size();
    for (const auto &i : j.get_array())
    {
        if (i->get_instance_type() != json::object_e &&
            i->get_instance_type() != json::array_e)
        {
            print_indent(indent_level + m_indent_inc);
        }
        unparse(*i, indent_level + m_indent_inc);
        if (n-- > 1)
        {
            m_writer << ',' << m_space;
        }
        m_writer << m_newline;
    }
    print_indent(indent_level);
    m_writer << m_space << ']';
}